

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O2

idx_t __thiscall duckdb::LocalStorage::AddedRows(LocalStorage *this,DataTable *table)

{
  LocalTableStorage *pLVar1;
  RowGroupCollection *this_00;
  idx_t iVar2;
  optional_ptr<duckdb::LocalTableStorage,_true> storage;
  optional_ptr<duckdb::LocalTableStorage,_true> local_18;
  
  local_18 = LocalTableManager::GetStorage(&this->table_manager,table);
  if (local_18.ptr == (LocalTableStorage *)0x0) {
    iVar2 = 0;
  }
  else {
    pLVar1 = optional_ptr<duckdb::LocalTableStorage,_true>::operator->(&local_18);
    this_00 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&pLVar1->row_groups);
    iVar2 = RowGroupCollection::GetTotalRows(this_00);
    pLVar1 = optional_ptr<duckdb::LocalTableStorage,_true>::operator->(&local_18);
    iVar2 = iVar2 - pLVar1->deleted_rows;
  }
  return iVar2;
}

Assistant:

idx_t LocalStorage::AddedRows(DataTable &table) {
	auto storage = table_manager.GetStorage(table);
	if (!storage) {
		return 0;
	}
	return storage->row_groups->GetTotalRows() - storage->deleted_rows;
}